

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O1

void movhps_VM(PDISASM pMyDisasm)

{
  char *pcVar1;
  UInt8 UVar2;
  ulong uVar3;
  uint uVar4;
  
  if ((pMyDisasm->Reserved_).VEX.state != '\x01') {
    if ((pMyDisasm->Reserved_).PrefRepe == 1) {
      (pMyDisasm->Prefix).RepPrefix = '\b';
      (pMyDisasm->Reserved_).MemDecoration = 0x6d;
      (pMyDisasm->Instruction).Category = 0x60001;
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"movshdup",9);
      (pMyDisasm->Reserved_).Register_ = 4;
      decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
      decodeRegOpcode(&pMyDisasm->Operand1,pMyDisasm);
      (pMyDisasm->Reserved_).EIP_ =
           (pMyDisasm->Reserved_).EIP_ + (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2);
      return;
    }
    if ((pMyDisasm->Prefix).OperandSize == '\x01') {
      (pMyDisasm->Reserved_).OperandSize = (pMyDisasm->Reserved_).OriginalOperandSize;
      (pMyDisasm->Prefix).OperandSize = '\b';
      (pMyDisasm->Reserved_).MemDecoration = 0x68;
      (pMyDisasm->Instruction).Category = 0x50001;
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"movhpd",7);
    }
    else {
      (pMyDisasm->Reserved_).MemDecoration = 0x68;
      (pMyDisasm->Instruction).Category = 0x40001;
      uVar3 = (pMyDisasm->Reserved_).EndOfBlock;
      if ((uVar3 != 0) && (uVar3 < (pMyDisasm->Reserved_).EIP_ + 2)) {
LAB_00119c9c:
        (pMyDisasm->Reserved_).OutOfBlock = 1;
        (pMyDisasm->Reserved_).ERROR_OPCODE = -2;
        return;
      }
      uVar4 = (uint)(*(byte *)((pMyDisasm->Reserved_).EIP_ + 1) >> 6);
      (pMyDisasm->Reserved_).MOD_ = uVar4;
      pcVar1 = (pMyDisasm->Instruction).Mnemonic;
      if (uVar4 == 3) {
        builtin_strncpy(pcVar1,"movlhps",8);
      }
      else {
        builtin_strncpy(pcVar1,"movhps",7);
      }
    }
    (pMyDisasm->Reserved_).Register_ = 4;
    decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
    decodeRegOpcode(&pMyDisasm->Operand1,pMyDisasm);
    (pMyDisasm->Reserved_).EIP_ =
         (pMyDisasm->Reserved_).EIP_ + (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2);
    (pMyDisasm->Operand1).AccessMode = 3;
    return;
  }
  UVar2 = (pMyDisasm->Reserved_).VEX.pp;
  if (UVar2 == '\0') {
    if ((pMyDisasm->Reserved_).VEX.L != '\x01') {
      ArgsVEX(pMyDisasm);
      if ((pMyDisasm->Reserved_).MOD_ == 3) {
        builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"vmovlhps",9);
        return;
      }
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"vmovhps",8);
      if ((pMyDisasm->Reserved_).EVEX.state == '\x01') {
        (pMyDisasm->Reserved_).EVEX.tupletype = '\t';
      }
LAB_00119d7e:
      (pMyDisasm->Reserved_).MemDecoration = 0xcc;
      return;
    }
  }
  else {
    if (UVar2 == '\x02') {
      if ((pMyDisasm->Reserved_).EVEX.state == '\x01') {
        (pMyDisasm->Reserved_).EVEX.tupletype = '\x03';
      }
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"vmovshdup",10);
      vex_GxEx(pMyDisasm);
      return;
    }
    if (UVar2 == '\x01') {
      uVar3 = (pMyDisasm->Reserved_).EndOfBlock;
      if ((uVar3 != 0) && (uVar3 < (pMyDisasm->Reserved_).EIP_ + 2)) goto LAB_00119c9c;
      uVar4 = (uint)(*(byte *)((pMyDisasm->Reserved_).EIP_ + 1) >> 6);
      (pMyDisasm->Reserved_).MOD_ = uVar4;
      if (uVar4 != 3) {
        if ((pMyDisasm->Reserved_).EVEX.state == '\x01') {
          (pMyDisasm->Reserved_).EVEX.tupletype = '\b';
        }
        ArgsVEX(pMyDisasm);
        builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"vmovhpd",8);
        goto LAB_00119d7e;
      }
    }
  }
  builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"???",4);
  (pMyDisasm->Operand1).AccessMode = 0;
  (pMyDisasm->Operand2).AccessMode = 0;
  (pMyDisasm->Operand3).AccessMode = 0;
  (pMyDisasm->Operand4).AccessMode = 0;
  (pMyDisasm->Operand5).AccessMode = 0;
  (pMyDisasm->Operand6).AccessMode = 0;
  (pMyDisasm->Operand7).AccessMode = 0;
  (pMyDisasm->Operand8).AccessMode = 0;
  (pMyDisasm->Operand9).AccessMode = 0;
  (pMyDisasm->Reserved_).ERROR_OPCODE = -1;
  return;
}

Assistant:

void __bea_callspec__ movhps_VM(PDISASM pMyDisasm)
{
 if (GV.VEX.state == InUsePrefix) {
   if (GV.VEX.pp == 0x1) {
     if (!Security(2, pMyDisasm)) return;
     GV.MOD_= ((*((UInt8*) (GV.EIP_+1))) >> 6) & 0x3;
     if (GV.MOD_ == 0x3) {
       failDecode(pMyDisasm);
     }
     else {
       if (GV.EVEX.state == InUsePrefix) GV.EVEX.tupletype = TUPLE1_FIXED__64;
       ArgsVEX(pMyDisasm);
       #ifndef BEA_LIGHT_DISASSEMBLY
          (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vmovhpd");
       #endif
       GV.MemDecoration = Arg3qword;
     }
   }
   else if (GV.VEX.pp == 0x2) {
     if (GV.EVEX.state == InUsePrefix) GV.EVEX.tupletype = FULL_MEM;
     #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vmovshdup");
     #endif
     vex_GxEx(pMyDisasm);
   }
   else if (GV.VEX.pp == 0x0) {
     if (GV.VEX.L == 1) { failDecode(pMyDisasm); return; }
     ArgsVEX(pMyDisasm);
     if (GV.MOD_ == 0x3) {
       #ifndef BEA_LIGHT_DISASSEMBLY
          (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vmovlhps");
       #endif
     }
     else {
       #ifndef BEA_LIGHT_DISASSEMBLY
          (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vmovhps");
       #endif
       if (GV.EVEX.state == InUsePrefix) GV.EVEX.tupletype = TUPLE2;
       GV.MemDecoration = Arg3qword;
     }
   }
   else {
     failDecode(pMyDisasm);
   }
 }
 else {
   /* ========= 0xf3 */
   if (GV.PrefRepe == 1) {
     pMyDisasm->Prefix.RepPrefix = MandatoryPrefix;
     GV.MemDecoration = Arg2_m128_xmm;
     pMyDisasm->Instruction.Category = SSE3_INSTRUCTION+DATA_TRANSFER;
     #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "movshdup");
     #endif
     GV.Register_ = SSE_REG;
     GxEx(pMyDisasm);

   }
   /* ========== 0x66 */
   else if (pMyDisasm->Prefix.OperandSize == InUsePrefix) {
     GV.OperandSize = GV.OriginalOperandSize;
     pMyDisasm->Prefix.OperandSize = MandatoryPrefix;
     GV.MemDecoration = Arg2qword;
     pMyDisasm->Instruction.Category = SSE2_INSTRUCTION+DATA_TRANSFER;
     #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "movhpd");
     #endif
     GV.Register_ = SSE_REG;
     GxEx(pMyDisasm);
     pMyDisasm->Operand1.AccessMode = READ + WRITE;

   }
   else {
     GV.MemDecoration = Arg2qword;
     pMyDisasm->Instruction.Category = SSE_INSTRUCTION+DATA_TRANSFER;
     if (!Security(2, pMyDisasm)) return;
     GV.MOD_= ((*((UInt8*) (GV.EIP_+1))) >> 6) & 0x3;
     if (GV.MOD_== 0x3) {
       #ifndef BEA_LIGHT_DISASSEMBLY
          (void) strcpy (pMyDisasm->Instruction.Mnemonic, "movlhps");
       #endif
     }
     else {
       #ifndef BEA_LIGHT_DISASSEMBLY
          (void) strcpy (pMyDisasm->Instruction.Mnemonic, "movhps");
       #endif
     }
     GV.Register_ = SSE_REG;
     GxEx(pMyDisasm);
     pMyDisasm->Operand1.AccessMode = READ + WRITE;

   }
 }
}